

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

double __thiscall Matrix<double,_3,_1>::norm(Matrix<double,_3,_1> *this)

{
  double dVar1;
  double *pdVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  double sum;
  Matrix<double,_3,_1> *this_local;
  
  if ((this->rows < 1) || (this->cols < 1)) {
    this_local = (Matrix<double,_3,_1> *)0xbff0000000000000;
  }
  else {
    _j = 0.0;
    for (local_24 = 0; local_24 < this->rows; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < this->cols; local_28 = local_28 + 1) {
        pdVar2 = operator()(this,local_24,local_28);
        dVar1 = *pdVar2;
        pdVar2 = operator()(this,local_24,local_28);
        _j = dVar1 * *pdVar2 + _j;
      }
    }
    this_local = (Matrix<double,_3,_1> *)sqrt(_j);
  }
  return (double)this_local;
}

Assistant:

double Matrix<T, _0, _1>::norm()
{
    if(this->rows <= 0 || this->cols <= 0)
        return -1;
    double sum = 0;
    for(int i = 0; i < rows; ++i)
        for(int j = 0; j < cols; ++j)
            sum += this->operator()(i, j) * this->operator()(i, j);
    return sqrt(sum);
}